

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O3

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::
read_next(basic_csv_cursor<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
         basic_json_visitor<char> *visitor,error_code *ec)

{
  char *pcVar1;
  span<const_char,_18446744073709551615UL> sVar2;
  
  (this->parser_).more_ = true;
  while( true ) {
    if ((this->parser_).input_ptr_ == (this->parser_).input_end_) {
      sVar2 = text_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
      pcVar1 = sVar2.data_;
      if (ec->_M_value != 0) {
        return;
      }
      if (sVar2.size_ != 0) {
        (this->parser_).begin_input_ = pcVar1;
        (this->parser_).input_end_ = pcVar1 + sVar2.size_;
        (this->parser_).input_ptr_ = pcVar1;
      }
    }
    basic_csv_parser<char,_std::allocator<char>_>::parse_some(&this->parser_,visitor,ec);
    if (ec->_M_value != 0) break;
    if (((this->parser_).more_ & 1U) == 0) {
      return;
    }
  }
  return;
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                }
            }
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
        }
    }